

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O3

void amrex::OverrideSync_finish<amrex::FArrayBox,void>(FabArray<amrex::FArrayBox> *fa)

{
  FabArray<amrex::FArrayBox> *pFVar1;
  long lVar2;
  IntVect local_1c;
  
  lVar2 = 0xc;
  switch((fa->super_FabArrayBase).boxarray.m_bat.m_bat_type) {
  case null:
  case coarsenRatio:
    return;
  case indexType:
  case indexType_coarsenRatio:
    break;
  default:
    lVar2 = 0x10;
  }
  if (*(int *)((long)&(fa->super_FabArrayBase)._vptr_FabArrayBase + lVar2) == 0) {
    return;
  }
  local_1c.vect[0] = 0;
  local_1c.vect[1] = 0;
  local_1c.vect[2] = 0;
  Copy<amrex::FArrayBox,void>
            (fa,(fa->os_temp)._M_t.
                super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl,0,0,
             (fa->super_FabArrayBase).n_comp,&local_1c);
  pFVar1 = (fa->os_temp)._M_t.
           super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
           .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl;
  (fa->os_temp)._M_t.
  super___uniq_ptr_impl<amrex::FabArray<amrex::FArrayBox>,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabArray<amrex::FArrayBox> *)0x0;
  if (pFVar1 == (FabArray<amrex::FArrayBox> *)0x0) {
    return;
  }
  (**(code **)((long)(pFVar1->super_FabArrayBase)._vptr_FabArrayBase + 8))();
  return;
}

Assistant:

void
OverrideSync_finish (FabArray<FAB> & fa)
{
    BL_PROFILE("OverrideSync_finish()");

    if (fa.ixType().cellCentered()) return;

    fa.os_temp->ParallelCopy_finish();
    amrex::Copy(fa, *(fa.os_temp), 0, 0, fa.nComp(), 0);

    fa.os_temp.reset();
}